

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

bool __thiscall
Js::ByteCodeWriter::TryWriteBrReg1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
          (ByteCodeWriter *this,OpCode op,ByteCodeLabel labelID,RegSlot R1)

{
  undefined2 local_2e;
  RegSlot local_2c;
  OpLayoutT_BrReg1<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> layout;
  
  local_2e = 6;
  local_2c = R1;
  Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,op,&local_2e,6,this);
  AddJumpOffset(this,op,labelID,6);
  return true;
}

Assistant:

bool ByteCodeWriter::TryWriteBrReg1(OpCode op, ByteCodeLabel labelID, RegSlot R1)
    {
        OpLayoutT_BrReg1<SizePolicy> layout;
        if (SizePolicy::Assign(layout.R1, R1))
        {
            size_t const offsetOfRelativeJumpOffsetFromEnd = sizeof(OpLayoutT_BrReg1<SizePolicy>) - offsetof(OpLayoutT_BrReg1<SizePolicy>, RelativeJumpOffset);
            layout.RelativeJumpOffset = offsetOfRelativeJumpOffsetFromEnd;
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            AddJumpOffset(op, labelID, offsetOfRelativeJumpOffsetFromEnd);
            return true;
        }
        return false;
    }